

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O0

void ExportSkin(Asset *mAsset,aiMesh *aimesh,Ref<glTF2::Mesh> *meshRef,Ref<glTF2::Buffer> *bufferRef
               ,Ref<glTF2::Skin> *skinRef,
               vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
               *inverseBindMatricesData)

{
  undefined4 uVar1;
  size_t pBufferData_Offset;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  void *data;
  void *data_00;
  void *pvVar12;
  char *id;
  Node *pNVar13;
  Node *pNVar14;
  Skin *pSVar15;
  size_type sVar16;
  reference this;
  Mesh *pMVar17;
  Accessor *pAVar18;
  BufferView *pBVar19;
  uint8_t *pReplace_Data;
  Buffer *pBVar20;
  uint8_t *puVar21;
  Ref<glTF2::Node> RVar22;
  Ref<glTF2::Accessor> RVar23;
  undefined1 local_178 [8];
  Ref<glTF2::Accessor> vertexWeightAccessor;
  unsigned_short c;
  float f_value;
  size_t len_p;
  uint j_1;
  uint i_1;
  uint8_t *arrys;
  Ref<glTF2::Buffer> buf;
  size_t s_bytesLen;
  uint bytesPerComp;
  uint s_bytesPerComp;
  size_t bytesLen;
  size_t offset;
  undefined1 local_108 [8];
  Ref<glTF2::Accessor> vertexJointAccessor;
  Primitive *p;
  float vertWeight;
  uint vertexId;
  uint idx_weights;
  aiMatrix4x4 tmpMatrix4;
  uint idx_joint;
  bool addJointToJointNames;
  uint jointNamesIndex;
  undefined1 local_88 [8];
  Ref<glTF2::Node> nodeRef;
  aiBone *aib;
  ulong uStack_68;
  uint idx_bone;
  size_t j;
  size_t i;
  int *jointsPerVertex;
  vec4 *vertexWeightData;
  vec4 *vertexJointData;
  size_t NumVerts;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *inverseBindMatricesData_local;
  Ref<glTF2::Skin> *skinRef_local;
  Ref<glTF2::Buffer> *bufferRef_local;
  Ref<glTF2::Mesh> *meshRef_local;
  aiMesh *aimesh_local;
  Asset *mAsset_local;
  
  if (aimesh->mNumBones != 0) {
    uVar10 = CONCAT44(0,aimesh->mNumVertices);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar10;
    uVar11 = SUB168(auVar2 * ZEXT816(0x10),0);
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    data = operator_new__(uVar11);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar10;
    uVar11 = SUB168(auVar3 * ZEXT816(0x10),0);
    if (SUB168(auVar3 * ZEXT816(0x10),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    data_00 = operator_new__(uVar11);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar10;
    uVar11 = SUB168(auVar4 * ZEXT816(4),0);
    if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    pvVar12 = operator_new__(uVar11);
    for (j = 0; j < uVar10; j = j + 1) {
      *(undefined4 *)((long)pvVar12 + j * 4) = 0;
      for (uStack_68 = 0; uStack_68 < 4; uStack_68 = uStack_68 + 1) {
        *(undefined4 *)((long)data + uStack_68 * 4 + j * 0x10) = 0;
        *(undefined4 *)((long)data_00 + uStack_68 * 4 + j * 0x10) = 0;
      }
    }
    for (aib._4_4_ = 0; aib._4_4_ < aimesh->mNumBones; aib._4_4_ = aib._4_4_ + 1) {
      nodeRef._8_8_ = aimesh->mBones[aib._4_4_];
      id = aiString::C_Str((aiString *)nodeRef._8_8_);
      RVar22 = glTF2::LazyDict<glTF2::Node>::Get(&mAsset->nodes,id);
      local_88 = (undefined1  [8])RVar22.vector;
      nodeRef.vector._0_4_ = RVar22.index;
      pNVar13 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_88);
      pNVar14 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_88);
      std::__cxx11::string::operator=
                ((string *)&pNVar14->jointName,(string *)&(pNVar13->super_Object).name);
      idx_joint = 0;
      tmpMatrix4.d4._3_1_ = 1;
      tmpMatrix4.d3 = 0.0;
      while( true ) {
        uVar10 = (ulong)(uint)tmpMatrix4.d3;
        pSVar15 = glTF2::Ref<glTF2::Skin>::operator->(skinRef);
        sVar16 = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::
                 size(&pSVar15->jointNames);
        if (sVar16 <= uVar10) break;
        pSVar15 = glTF2::Ref<glTF2::Skin>::operator->(skinRef);
        this = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::
               operator[](&pSVar15->jointNames,(ulong)(uint)tmpMatrix4.d3);
        pNVar13 = glTF2::Ref<glTF2::Node>::operator->(this);
        glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_88);
        iVar7 = std::__cxx11::string::compare((string *)&pNVar13->jointName);
        if (iVar7 == 0) {
          tmpMatrix4.d4._3_1_ = 0;
          idx_joint = (uint)tmpMatrix4.d3;
        }
        tmpMatrix4.d3 = (float)((int)tmpMatrix4.d3 + 1);
      }
      if ((tmpMatrix4.d4._3_1_ & 1) != 0) {
        pSVar15 = glTF2::Ref<glTF2::Skin>::operator->(skinRef);
        std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::push_back
                  (&pSVar15->jointNames,(value_type *)local_88);
        aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&vertexId);
        CopyValue((aiMatrix4x4 *)(nodeRef._8_8_ + 0x410),(aiMatrix4x4 *)&vertexId);
        std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::push_back
                  (inverseBindMatricesData,(value_type *)&vertexId);
        sVar16 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                           (inverseBindMatricesData);
        idx_joint = (int)sVar16 - 1;
      }
      for (vertWeight = 0.0; (uint)vertWeight < (uint)*(float *)(nodeRef._8_8_ + 0x404);
          vertWeight = (float)((int)vertWeight + 1)) {
        uVar8 = *(uint *)(*(long *)(nodeRef._8_8_ + 0x408) + (ulong)(uint)vertWeight * 8);
        uVar1 = *(undefined4 *)(*(long *)(nodeRef._8_8_ + 0x408) + 4 + (ulong)(uint)vertWeight * 8);
        if (*(int *)((long)pvVar12 + (ulong)uVar8 * 4) < 4) {
          *(float *)((long)data +
                    (long)*(int *)((long)pvVar12 + (ulong)uVar8 * 4) * 4 + (ulong)uVar8 * 0x10) =
               (float)idx_joint;
          *(undefined4 *)
           ((long)data_00 +
           (long)*(int *)((long)pvVar12 + (ulong)uVar8 * 4) * 4 + (ulong)uVar8 * 0x10) = uVar1;
          *(int *)((long)pvVar12 + (ulong)uVar8 * 4) =
               *(int *)((long)pvVar12 + (ulong)uVar8 * 4) + 1;
        }
      }
    }
    pMVar17 = glTF2::Ref<glTF2::Mesh>::operator->(meshRef);
    vertexJointAccessor._8_8_ =
         std::vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>::back
                   (&pMVar17->primitives);
    pSVar15 = glTF2::Ref<glTF2::Skin>::operator->(skinRef);
    RVar23 = ExportData(mAsset,&(pSVar15->super_Object).id,bufferRef,(ulong)aimesh->mNumVertices,
                        data,VEC4,VEC4,ComponentType_FLOAT,false);
    local_108 = (undefined1  [8])RVar23.vector;
    vertexJointAccessor.vector._0_4_ = RVar23.index;
    bVar6 = glTF2::Ref::operator_cast_to_bool((Ref *)local_108);
    if (bVar6) {
      pAVar18 = glTF2::Ref<glTF2::Accessor>::operator->((Ref<glTF2::Accessor> *)local_108);
      pBVar19 = glTF2::Ref<glTF2::BufferView>::operator->(&pAVar18->bufferView);
      pBufferData_Offset = pBVar19->byteOffset;
      pAVar18 = glTF2::Ref<glTF2::Accessor>::operator->((Ref<glTF2::Accessor> *)local_108);
      pBVar19 = glTF2::Ref<glTF2::BufferView>::operator->(&pAVar18->bufferView);
      uVar10 = pBVar19->byteLength;
      uVar8 = glTF2::ComponentTypeSize(ComponentType_UNSIGNED_SHORT);
      pAVar18 = glTF2::Ref<glTF2::Accessor>::operator->((Ref<glTF2::Accessor> *)local_108);
      uVar9 = glTF2::ComponentTypeSize(pAVar18->componentType);
      buf._8_8_ = (uVar10 * uVar8) / (ulong)uVar9;
      pAVar18 = glTF2::Ref<glTF2::Accessor>::operator->((Ref<glTF2::Accessor> *)local_108);
      pBVar19 = glTF2::Ref<glTF2::BufferView>::operator->(&pAVar18->bufferView);
      arrys = (uint8_t *)(pBVar19->buffer).vector;
      buf.vector = *(vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> **)
                    &(pBVar19->buffer).index;
      pReplace_Data = (uint8_t *)operator_new__(uVar10);
      len_p._4_4_ = 0;
      for (len_p._0_4_ = 0; (uint)len_p <= uVar10; len_p._0_4_ = uVar9 + (uint)len_p) {
        pBVar20 = glTF2::Ref<glTF2::Buffer>::operator->((Ref<glTF2::Buffer> *)&arrys);
        puVar21 = glTF2::Buffer::GetPointer(pBVar20);
        vertexWeightAccessor._12_4_ = *(undefined4 *)(puVar21 + pBufferData_Offset + (uint)len_p);
        vertexWeightAccessor.index._2_2_ = (undefined2)(int)(float)vertexWeightAccessor._12_4_;
        memcpy(pReplace_Data + len_p._4_4_ * uVar8,(void *)((long)&vertexWeightAccessor.index + 2),
               (ulong)uVar8);
        len_p._4_4_ = len_p._4_4_ + 1;
      }
      pBVar20 = glTF2::Ref<glTF2::Buffer>::operator->((Ref<glTF2::Buffer> *)&arrys);
      glTF2::Buffer::ReplaceData_joint(pBVar20,pBufferData_Offset,uVar10,pReplace_Data,uVar10);
      pAVar18 = glTF2::Ref<glTF2::Accessor>::operator->((Ref<glTF2::Accessor> *)local_108);
      uVar5 = buf._8_8_;
      pAVar18->componentType = ComponentType_UNSIGNED_SHORT;
      pAVar18 = glTF2::Ref<glTF2::Accessor>::operator->((Ref<glTF2::Accessor> *)local_108);
      pBVar19 = glTF2::Ref<glTF2::BufferView>::operator->(&pAVar18->bufferView);
      pBVar19->byteLength = uVar5;
      std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
      push_back((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                 *)(vertexJointAccessor._8_8_ + 0x80),(value_type *)local_108);
      if (pReplace_Data != (uint8_t *)0x0) {
        operator_delete__(pReplace_Data);
      }
    }
    pSVar15 = glTF2::Ref<glTF2::Skin>::operator->(skinRef);
    RVar23 = ExportData(mAsset,&(pSVar15->super_Object).id,bufferRef,(ulong)aimesh->mNumVertices,
                        data_00,VEC4,VEC4,ComponentType_FLOAT,false);
    local_178 = (undefined1  [8])RVar23.vector;
    vertexWeightAccessor.vector._0_4_ = RVar23.index;
    bVar6 = glTF2::Ref::operator_cast_to_bool((Ref *)local_178);
    if (bVar6) {
      std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
      push_back((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                 *)(vertexJointAccessor._8_8_ + 0xb0),(value_type *)local_178);
    }
    if (pvVar12 != (void *)0x0) {
      operator_delete__(pvVar12);
    }
    if (data_00 != (void *)0x0) {
      operator_delete__(data_00);
    }
    if (data != (void *)0x0) {
      operator_delete__(data);
    }
  }
  return;
}

Assistant:

void ExportSkin(Asset& mAsset, const aiMesh* aimesh, Ref<Mesh>& meshRef, Ref<Buffer>& bufferRef, Ref<Skin>& skinRef, std::vector<aiMatrix4x4>& inverseBindMatricesData)
{
    if (aimesh->mNumBones < 1) {
        return;
    }

    // Store the vertex joint and weight data.
    const size_t NumVerts( aimesh->mNumVertices );
    vec4* vertexJointData = new vec4[ NumVerts ];
    vec4* vertexWeightData = new vec4[ NumVerts ];
    int* jointsPerVertex = new int[ NumVerts ];
    for (size_t i = 0; i < NumVerts; ++i) {
        jointsPerVertex[i] = 0;
        for (size_t j = 0; j < 4; ++j) {
            vertexJointData[i][j] = 0;
            vertexWeightData[i][j] = 0;
        }
    }

    for (unsigned int idx_bone = 0; idx_bone < aimesh->mNumBones; ++idx_bone) {
        const aiBone* aib = aimesh->mBones[idx_bone];

        // aib->mName   =====>  skinRef->jointNames
        // Find the node with id = mName.
        Ref<Node> nodeRef = mAsset.nodes.Get(aib->mName.C_Str());
        nodeRef->jointName = nodeRef->name;

        unsigned int jointNamesIndex = 0;
        bool addJointToJointNames = true;
        for ( unsigned int idx_joint = 0; idx_joint < skinRef->jointNames.size(); ++idx_joint) {
            if (skinRef->jointNames[idx_joint]->jointName.compare(nodeRef->jointName) == 0) {
                addJointToJointNames = false;
                jointNamesIndex = idx_joint;
            }
        }

        if (addJointToJointNames) {
            skinRef->jointNames.push_back(nodeRef);

            // aib->mOffsetMatrix   =====>  skinRef->inverseBindMatrices
            aiMatrix4x4 tmpMatrix4;
            CopyValue(aib->mOffsetMatrix, tmpMatrix4);
            inverseBindMatricesData.push_back(tmpMatrix4);
            jointNamesIndex = static_cast<unsigned int>(inverseBindMatricesData.size() - 1);
        }

        // aib->mWeights   =====>  vertexWeightData
        for (unsigned int idx_weights = 0; idx_weights < aib->mNumWeights; ++idx_weights) {
            unsigned int vertexId = aib->mWeights[idx_weights].mVertexId;
            float vertWeight      = aib->mWeights[idx_weights].mWeight;

            // A vertex can only have at most four joint weights. Ignore all others.
            if (jointsPerVertex[vertexId] > 3) {
                continue;
            }

            vertexJointData[vertexId][jointsPerVertex[vertexId]] = static_cast<float>(jointNamesIndex);
            vertexWeightData[vertexId][jointsPerVertex[vertexId]] = vertWeight;

            jointsPerVertex[vertexId] += 1;
        }

    } // End: for-loop mNumMeshes

    Mesh::Primitive& p = meshRef->primitives.back();
    Ref<Accessor> vertexJointAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices, vertexJointData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexJointAccessor ) {
        size_t offset = vertexJointAccessor->bufferView->byteOffset;
        size_t bytesLen = vertexJointAccessor->bufferView->byteLength;
        unsigned int s_bytesPerComp= ComponentTypeSize(ComponentType_UNSIGNED_SHORT);
        unsigned int bytesPerComp = ComponentTypeSize(vertexJointAccessor->componentType);
        size_t s_bytesLen = bytesLen * s_bytesPerComp / bytesPerComp;
        Ref<Buffer> buf = vertexJointAccessor->bufferView->buffer;
        uint8_t* arrys = new uint8_t[bytesLen];
        unsigned int i = 0;
        for ( unsigned int j = 0; j <= bytesLen; j += bytesPerComp ){
            size_t len_p = offset + j;
            float f_value = *(float *)&buf->GetPointer()[len_p];
            unsigned short c = static_cast<unsigned short>(f_value);
            memcpy(&arrys[i*s_bytesPerComp], &c, s_bytesPerComp);
            ++i;
        }
        buf->ReplaceData_joint(offset, bytesLen, arrys, bytesLen);
        vertexJointAccessor->componentType = ComponentType_UNSIGNED_SHORT;
        vertexJointAccessor->bufferView->byteLength = s_bytesLen;

        p.attributes.joint.push_back( vertexJointAccessor );
        delete[] arrys;
    }

    Ref<Accessor> vertexWeightAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices,
            vertexWeightData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexWeightAccessor ) {
        p.attributes.weight.push_back( vertexWeightAccessor );
    }
    delete[] jointsPerVertex;
    delete[] vertexWeightData;
    delete[] vertexJointData;
}